

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O1

Real Q_GetVal(QMatrix *Q,size_t RoC,size_t Entry)

{
  LASErrIdType LVar1;
  Real RVar2;
  
  LVar1 = LASResult();
  RVar2 = 0.0;
  if (LVar1 == LASOK) {
    if (((RoC == 0) || (Q->Dim < RoC)) || (Q->Len[RoC] <= Entry)) {
      LASError(LASRangeErr,"Q_GetVal",Q->Name,(char *)0x0,(char *)0x0);
      RVar2 = 0.0;
    }
    else {
      RVar2 = Q->El[RoC][Entry].Val;
    }
  }
  return RVar2;
}

Assistant:

Real Q_GetVal(QMatrix *Q, size_t RoC, size_t Entry)
/* returns the value of a matrix element */
{
    Real Val;

    if (LASResult() == LASOK)
        if (RoC > 0 && RoC <= Q->Dim && Entry < Q->Len[RoC]) {
            Val = Q->El[RoC][Entry].Val;
        } else {
            LASError(LASRangeErr, "Q_GetVal", Q->Name, NULL, NULL);
            Val = 0.0;
        }
    else
        Val = 0.0;
    return(Val);
}